

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O1

int If_CutGetCone_rec(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    lVar2 = 0;
    do {
      if ((&pCut[1].Area)[lVar2] == (float)pObj->Id) {
        return 1;
      }
    } while (((int)(&pCut[1].Area)[lVar2] <= pObj->Id) &&
            (bVar3 = (ulong)(*(uint *)&pCut->field_0x1c >> 0x18) - 1 != lVar2, lVar2 = lVar2 + 1,
            bVar3));
  }
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
    do {
      iVar1 = If_CutGetCone_rec(p,pObj->pFanin0,pCut);
      if ((iVar1 != 0) && (iVar1 = If_CutGetCone_rec(p,pObj->pFanin1,pCut), iVar1 != 0)) {
        return 1;
      }
      pObj = pObj->pEquiv;
    } while (pObj != (If_Obj_t *)0x0);
  }
  return 0;
}

Assistant:

int If_CutGetCone_rec( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pTemp;
    int i, RetValue;
    // check if the node is in the cut
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
            return 1;
        else if ( pCut->pLeaves[i] > pObj->Id )
            break;
    // return if we reached the boundary
    if ( If_ObjIsCi(pObj) )
        return 0;
    // check the choice node
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        // check if the node itself is bound
        RetValue = If_CutGetCone_rec( p, If_ObjFanin0(pTemp), pCut );
        if ( RetValue )
            RetValue &= If_CutGetCone_rec( p, If_ObjFanin1(pTemp), pCut );
        if ( RetValue )
            return 1;
    }
    return 0;
}